

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

NumericExpr * __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::
ReadNumericExpr_abi_cxx11_
          (NumericExpr *__return_storage_ptr__,
          NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter> *this,
          int opcode)

{
  Kind KVar1;
  Kind kind;
  ExprPrinter *pEVar2;
  int iVar3;
  NumericExpr *this_00;
  Reference *__return_storage_ptr___00;
  int iVar4;
  LogicalExpr condition;
  string local_1c8 [32];
  NumericExpr local_1a8;
  NumericExpr else_expr;
  NumericExpr then_expr;
  string local_148;
  string local_128;
  string local_108 [32];
  string local_e8 [32];
  NumericExpr local_c8;
  string local_a8 [32];
  Expr local_88;
  NumericExpr local_68;
  Reference local_48;
  
  __return_storage_ptr___00 = &condition;
  KVar1 = OpCodeInfo::INFO[opcode].first_kind;
  switch(KVar1) {
  case IF:
    ReadLogicalExpr_abi_cxx11_(&condition,this);
    ReadNumericExpr_abi_cxx11_(&then_expr,this,false);
    ReadNumericExpr_abi_cxx11_(&else_expr,this,false);
    std::__cxx11::string::string(local_e8,(string *)&condition);
    std::__cxx11::string::string(local_108,(string *)&then_expr);
    std::__cxx11::string::string(local_a8,(string *)&else_expr);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string((string *)&else_expr);
    this_00 = &then_expr;
    break;
  case PLTERM:
    iVar3 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                      (*(BinaryReader<mp::internal::IdentityConverter> **)this);
    if (iVar3 < 2) {
      BinaryReaderBase::ReportError<>(*(BinaryReaderBase **)this,(CStringRef)0x12cf1b);
    }
    iVar4 = 1;
    if (1 < iVar3) {
      iVar4 = iVar3;
    }
    while( true ) {
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::
      ReadConstant((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                    *)this);
      if (iVar4 + -1 == 0) break;
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::
      ReadConstant((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                    *)this);
      iVar4 = iVar4 + -1;
    }
    __return_storage_ptr___00 = &local_48;
    ReadReference_abi_cxx11_(__return_storage_ptr___00,this);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    goto LAB_0011fb38;
  case FIRST_ITERATED:
    iVar3 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::
            ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                         *)this,1);
    goto LAB_0011fbbf;
  case SUM:
    iVar3 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::
            ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                         *)this,3);
    condition._M_dataplus._M_p = (pointer)&condition.field_2;
    condition.field_2._M_allocated_capacity = 0;
    condition.field_2._8_8_ = 0;
    condition._M_string_length = 0;
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::NumericExprReader,ExprPrinter::NumericArgHandler>
              (this,iVar3,(NumericArgHandler *)&condition);
    pEVar2 = *(ExprPrinter **)(this + 0x10);
    std::__cxx11::string::string((string *)&local_1a8,(string *)&condition);
    ExprPrinter::EndSum_abi_cxx11_(__return_storage_ptr__,pEVar2,(NumericArgHandler *)&local_1a8);
    this_00 = &local_1a8;
    break;
  case LAST_ITERATED:
    iVar3 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::
            ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                         *)this,1);
    ReadNumericExpr_abi_cxx11_(&local_68,this,false);
    std::__cxx11::string::~string((string *)&local_68);
    iVar3 = iVar3 + -1;
LAB_0011fbbf:
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
              (this,iVar3,(ArgHandler *)&condition);
    goto LAB_0011fbc4;
  case NUMBEROF_SYM:
    iVar3 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::
            ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                         *)this,1);
    ReadSymbolicExpr_abi_cxx11_(&local_88,this);
    std::__cxx11::string::~string((string *)&local_88);
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::SymbolicExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
              (this,iVar3 + -1,(ArgHandler *)&condition);
    goto LAB_0011fbc4;
  case COUNT:
    ReadCountExpr_abi_cxx11_(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  default:
    kind = OpCodeInfo::INFO[opcode].kind;
    if (KVar1 == ADD) {
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::
      BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::NumericExprReader>
      ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::NumericExprReader>
                         *)&condition,
                        (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                         *)this);
      pEVar2 = *(ExprPrinter **)(this + 0x10);
      std::__cxx11::string::string((string *)&local_128,(string *)&condition);
      std::__cxx11::string::string((string *)&local_148,local_1c8);
      ExprPrinter::OnBinary(__return_storage_ptr__,pEVar2,kind,&local_128,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_128);
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::
      BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::NumericExprReader>
      ::~BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::NumericExprReader>
                          *)&condition);
      return __return_storage_ptr__;
    }
    if (KVar1 == FIRST_UNARY) {
      pEVar2 = *(ExprPrinter **)(this + 0x10);
      ReadNumericExpr_abi_cxx11_(&local_c8,this,false);
      ExprPrinter::OnUnary(__return_storage_ptr__,pEVar2,kind,&local_c8);
      __return_storage_ptr___00 = &local_c8;
      goto LAB_0011fb38;
    }
  case CALL:
  case LAST_VARARG:
    BinaryReaderBase::ReportError<>(*(BinaryReaderBase **)this,(CStringRef)0x12cf43);
LAB_0011fbc4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_0011fb38:
  std::__cxx11::string::~string((string *)__return_storage_ptr___00);
  return __return_storage_ptr__;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::FIRST_UNARY:
    return handler_.OnUnary(kind, ReadNumericExpr());
  case expr::FIRST_BINARY: {
    BinaryArgReader<> args(*this);
    return handler_.OnBinary(kind, args.lhs, args.rhs);
  }
  case expr::IF: {
    LogicalExpr condition = ReadLogicalExpr();
    NumericExpr then_expr = ReadNumericExpr();
    NumericExpr else_expr = ReadNumericExpr();
    return handler_.OnIf(condition, then_expr, else_expr);
  }
  case expr::PLTERM: {
    // Read a piecewise-linear term.
    int num_slopes = reader_.ReadUInt();
    if (num_slopes <= 1)
      reader_.ReportError("too few slopes in piecewise-linear term");
    reader_.ReadTillEndOfLine();
    typename Handler::PLTermHandler pl_handler =
        handler_.BeginPLTerm(num_slopes - 1);
    for (int i = 0; i < num_slopes - 1; ++i) {
      pl_handler.AddSlope(ReadConstant());
      pl_handler.AddBreakpoint(ReadConstant());
    }
    pl_handler.AddSlope(ReadConstant());
    return handler_.EndPLTerm(pl_handler, ReadReference());
  }
  case expr::FIRST_VARARG: {
    // Read a vararg expression (min or max).
    int num_args = ReadNumArgs(1);
    typename Handler::VarArgHandler args = handler_.BeginVarArg(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndVarArg(args);
  }
  case expr::SUM: {
    int num_args = ReadNumArgs();
    typename Handler::NumericArgHandler args = handler_.BeginSum(num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndSum(args);
  }
  case expr::COUNT:
    return ReadCountExpr();
  case expr::NUMBEROF: {
    // Read a numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::NumberOfArgHandler args =
        handler_.BeginNumberOf(num_args, ReadNumericExpr());
    DoReadArgs<NumericExprReader>(num_args - 1, args);
    return handler_.EndNumberOf(args);
  }
  case expr::NUMBEROF_SYM: {
    // Read a symbolic numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::SymbolicArgHandler args =
        handler_.BeginSymbolicNumberOf(num_args, ReadSymbolicExpr());
    DoReadArgs<SymbolicExprReader>(num_args - 1, args);
    return handler_.EndSymbolicNumberOf(args);
  }
  default:
    reader_.ReportError("expected numeric expression opcode");
  }
  return NumericExpr();
}